

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O0

wchar_t remove_autoinscription(int16_t kind)

{
  object_kind *poVar1;
  object_kind *k;
  int16_t kind_local;
  
  poVar1 = objkind_byid((int)kind);
  if (poVar1 == (object_kind *)0x0) {
    k._4_4_ = L'\0';
  }
  else if ((poVar1->aware & 1U) == 0) {
    if (poVar1->note_unaware == 0) {
      k._4_4_ = L'\0';
    }
    else {
      poVar1->note_unaware = 0;
      k._4_4_ = L'\x01';
    }
  }
  else if (poVar1->note_aware == 0) {
    k._4_4_ = L'\0';
  }
  else {
    poVar1->note_aware = 0;
    k._4_4_ = L'\x01';
  }
  return k._4_4_;
}

Assistant:

int remove_autoinscription(int16_t kind)
{
	struct object_kind *k = objkind_byid(kind);
	if (!k)
		return 0;

	/* Unaware */
	if (!k->aware) {
		if (!k->note_unaware) {
			return 0;
		} else {
			k->note_unaware = 0;
			return 1;
		}
	}

	/* Aware */
	if (!k->note_aware)
		return 0;

	k->note_aware = 0;
	return 1;
}